

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn_decoder.c
# Opt level: O3

int pt_insn_start(pt_insn_decoder *decoder,int status)

{
  int iVar1;
  
  if (-1 < status) {
    decoder->status = status;
    if ((status & 2U) == 0) {
      decoder->field_0xb00 = decoder->field_0xb00 | 1;
    }
    iVar1 = pt_insn_check_ip_event(decoder,(pt_insn *)0x0,(pt_insn_ext *)0x0);
    return iVar1;
  }
  return status;
}

Assistant:

static int pt_insn_start(struct pt_insn_decoder *decoder, int status)
{
	if (!decoder)
		return -pte_internal;

	if (status < 0)
		return status;

	decoder->status = status;

	if (!(status & pts_ip_suppressed))
		decoder->enabled = 1;

	/* Process any initial events.
	 *
	 * Some events are processed after proceeding to the next IP in order to
	 * indicate things like tracing disable or trace stop in the preceding
	 * instruction.  Those events will be processed without such an
	 * indication before decoding the current instruction.
	 *
	 * We do this already here so we can indicate user-events that precede
	 * the first instruction.
	 */
	return pt_insn_check_ip_event(decoder, NULL, NULL);
}